

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::MaybeRelativeTo
          (string *__return_storage_ptr__,cmOutputConverter *this,string *param_1,
          string *remote_path)

{
  bool local_66;
  bool local_65;
  byte local_64;
  byte local_63;
  byte local_62;
  byte local_61;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  bool bothInSource;
  bool bothInBinary;
  bool remoteInSource;
  bool localInSource;
  bool remoteInBinary;
  bool localInBinary;
  string *remote_path_local;
  string *local_path_local;
  cmOutputConverter *this_local;
  
  local_29 = anon_unknown.dwarf_f13949::PathEqOrSubDir(param_1,&this->RelativePathTopBinary);
  local_2a = anon_unknown.dwarf_f13949::PathEqOrSubDir(remote_path,&this->RelativePathTopBinary);
  local_2b = anon_unknown.dwarf_f13949::PathEqOrSubDir(param_1,&this->RelativePathTopSource);
  local_2c = anon_unknown.dwarf_f13949::PathEqOrSubDir(remote_path,&this->RelativePathTopSource);
  switch(this->RelativePathTopRelation) {
  case Separate:
    break;
  case BinInSrc:
    local_61 = 0;
    if (local_2b) {
      local_61 = local_29 ^ 0xff;
    }
    local_2b = (bool)(local_61 & 1);
    local_62 = 0;
    if (local_2c) {
      local_62 = local_2a ^ 0xff;
    }
    local_2c = (bool)(local_62 & 1);
    break;
  case SrcInBin:
    local_63 = 0;
    if (local_29) {
      local_63 = local_2b ^ 0xff;
    }
    local_29 = (bool)(local_63 & 1);
    local_64 = 0;
    if (local_2a) {
      local_64 = local_2c ^ 0xff;
    }
    local_2a = (bool)(local_64 & 1);
    break;
  case InSource:
  }
  local_65 = false;
  if (local_29 != false) {
    local_65 = local_2a;
  }
  local_66 = false;
  if (local_2b != false) {
    local_66 = local_2c;
  }
  if ((local_65 == false) && (local_66 == false)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)remote_path);
  }
  else {
    cmSystemTools::ForceToRelativePath(__return_storage_ptr__,param_1,remote_path);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::MaybeRelativeTo(
  std::string const& local_path, std::string const& remote_path) const
{
  bool localInBinary = PathEqOrSubDir(local_path, this->RelativePathTopBinary);
  bool remoteInBinary =
    PathEqOrSubDir(remote_path, this->RelativePathTopBinary);

  bool localInSource = PathEqOrSubDir(local_path, this->RelativePathTopSource);
  bool remoteInSource =
    PathEqOrSubDir(remote_path, this->RelativePathTopSource);

  switch (this->RelativePathTopRelation) {
    case TopRelation::Separate:
      // Checks are independent.
      break;
    case TopRelation::BinInSrc:
      localInSource = localInSource && !localInBinary;
      remoteInSource = remoteInSource && !remoteInBinary;
      break;
    case TopRelation::SrcInBin:
      localInBinary = localInBinary && !localInSource;
      remoteInBinary = remoteInBinary && !remoteInSource;
      break;
    case TopRelation::InSource:
      // Checks are identical.
      break;
  };

  bool const bothInBinary = localInBinary && remoteInBinary;
  bool const bothInSource = localInSource && remoteInSource;

  if (bothInBinary || bothInSource) {
    return cmSystemTools::ForceToRelativePath(local_path, remote_path);
  }
  return remote_path;
}